

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalPrinter<(anonymous_namespace)::TestVideoParam>::Print
               (anon_struct_48_8_bb454126_for__M_head_impl *value,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"TestVideoParam { filename:");
  poVar1 = std::operator<<(poVar1,value->filename);
  poVar1 = std::operator<<(poVar1," fmt:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value->fmt);
  poVar1 = std::operator<<(poVar1," bit_depth:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value->bit_depth);
  poVar1 = std::operator<<(poVar1," profile:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," limit:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," screen_content:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," psnr_threshold:");
  poVar1 = std::ostream::_M_insert<double>(value->psnr_threshold);
  std::operator<<(poVar1," }");
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }